

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O2

SysCallInt64Result cppnet::OsHandle::Accept(int64_t sockfd,Address *address)

{
  int iVar1;
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  string *this;
  SysCallInt64Result SVar5;
  allocator local_ed;
  socklen_t addr_size;
  char str_addr [16];
  char str_addr_1 [46];
  sockaddr_storage client_addr;
  
  addr_size = 0x80;
  iVar1 = accept((int)sockfd,(sockaddr *)&client_addr,&addr_size);
  lVar4 = (long)iVar1;
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    uVar3 = (ulong)*puVar2;
  }
  else {
    if (client_addr.ss_family == 10) {
      address->_port = client_addr.__ss_padding._0_2_;
      address->_address_type = AT_IPV6;
      str_addr_1[0x20] = '\0';
      str_addr_1[0x21] = '\0';
      str_addr_1[0x22] = '\0';
      str_addr_1[0x23] = '\0';
      str_addr_1[0x24] = '\0';
      str_addr_1[0x25] = '\0';
      str_addr_1[0x26] = '\0';
      str_addr_1[0x27] = '\0';
      str_addr_1[0x28] = '\0';
      str_addr_1[0x29] = '\0';
      str_addr_1[0x2a] = '\0';
      str_addr_1[0x2b] = '\0';
      str_addr_1[0x2c] = '\0';
      str_addr_1[0x2d] = '\0';
      str_addr_1[0x10] = '\0';
      str_addr_1[0x11] = '\0';
      str_addr_1[0x12] = '\0';
      str_addr_1[0x13] = '\0';
      str_addr_1[0x14] = '\0';
      str_addr_1[0x15] = '\0';
      str_addr_1[0x16] = '\0';
      str_addr_1[0x17] = '\0';
      str_addr_1[0x18] = '\0';
      str_addr_1[0x19] = '\0';
      str_addr_1[0x1a] = '\0';
      str_addr_1[0x1b] = '\0';
      str_addr_1[0x1c] = '\0';
      str_addr_1[0x1d] = '\0';
      str_addr_1[0x1e] = '\0';
      str_addr_1[0x1f] = '\0';
      str_addr_1[0] = '\0';
      str_addr_1[1] = '\0';
      str_addr_1[2] = '\0';
      str_addr_1[3] = '\0';
      str_addr_1[4] = '\0';
      str_addr_1[5] = '\0';
      str_addr_1[6] = '\0';
      str_addr_1[7] = '\0';
      str_addr_1[8] = '\0';
      str_addr_1[9] = '\0';
      str_addr_1[10] = '\0';
      str_addr_1[0xb] = '\0';
      str_addr_1[0xc] = '\0';
      str_addr_1[0xd] = '\0';
      str_addr_1[0xe] = '\0';
      str_addr_1[0xf] = '\0';
      inet_ntop(10,client_addr.__ss_padding + 6,str_addr_1,0x2e);
      std::__cxx11::string::string((string *)str_addr,str_addr_1,&local_ed);
      Address::SetIp(address,(string *)str_addr);
      this = (string *)str_addr;
    }
    else {
      if (client_addr.ss_family != 2) {
        puVar2 = (uint *)__errno_location();
        uVar3 = (ulong)*puVar2;
        lVar4 = -1;
        goto LAB_0011655c;
      }
      address->_port =
           client_addr.__ss_padding._0_2_ << 8 | (ushort)client_addr.__ss_padding._0_2_ >> 8;
      address->_address_type = AT_IPV4;
      str_addr[0] = '\0';
      str_addr[1] = '\0';
      str_addr[2] = '\0';
      str_addr[3] = '\0';
      str_addr[4] = '\0';
      str_addr[5] = '\0';
      str_addr[6] = '\0';
      str_addr[7] = '\0';
      str_addr[8] = '\0';
      str_addr[9] = '\0';
      str_addr[10] = '\0';
      str_addr[0xb] = '\0';
      str_addr[0xc] = '\0';
      str_addr[0xd] = '\0';
      str_addr[0xe] = '\0';
      str_addr[0xf] = '\0';
      inet_ntop(2,client_addr.__ss_padding + 2,str_addr,0x10);
      std::__cxx11::string::string((string *)str_addr_1,str_addr,&local_ed);
      Address::SetIp(address,(string *)str_addr_1);
      this = (string *)str_addr_1;
    }
    std::__cxx11::string::~string(this);
    uVar3 = 0;
  }
LAB_0011655c:
  SVar5._8_8_ = uVar3;
  SVar5._return_value = lVar4;
  return SVar5;
}

Assistant:

SysCallInt64Result OsHandle::Accept(int64_t sockfd, Address& address) {
    struct sockaddr_storage client_addr;
    socklen_t addr_size = sizeof(client_addr);
    int64_t ret = accept(sockfd, (sockaddr*)&client_addr, &addr_size);
    if (ret < 0) {
        return {ret, errno};
    }

    struct sockaddr* addr_pt = (struct sockaddr*)&client_addr;

    void *addr = nullptr;
    switch (addr_pt->sa_family) {
        case AF_INET:
		{
            addr = &((struct sockaddr_in *)addr_pt)->sin_addr;
            address.SetAddrPort(ntohs(((struct sockaddr_in *)addr_pt)->sin_port));
            address.SetType(AT_IPV4);
            // get IP
            char str_addr[INET_ADDRSTRLEN] = {0};
            inet_ntop(AF_INET, addr, str_addr, sizeof(str_addr));
            address.SetIp(str_addr);
            break;
		}
        case AF_INET6:
		{
            addr = &((struct sockaddr_in6 *)addr_pt)->sin6_addr;
            address.SetAddrPort((((struct sockaddr_in6 *)addr_pt)->sin6_port));
            address.SetType(AT_IPV6);
            // get IP
            char str_addr[INET6_ADDRSTRLEN] = {0};
            inet_ntop(AF_INET6, addr, str_addr, sizeof(str_addr));
            address.SetIp(str_addr);
            break;
		}
        default:
            return {-1, errno};
    }
    
    return {ret, 0};
}